

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldValue
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  TokenType TVar1;
  bool bVar2;
  __type _Var3;
  LogMessage *other;
  EnumValueDescriptor *pEVar4;
  _func_int **pp_Var5;
  byte bVar6;
  long i;
  EnumDescriptor *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined4 extraout_XMM0_Db;
  int64 value;
  char *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  int64 int_value;
  EnumDescriptor *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (9 < *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) - 1U) {
    return true;
  }
  switch(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4)) {
  case 1:
    bVar2 = ConsumeSignedInteger(this,&value,0x7fffffff);
    if (bVar2) {
      (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x18])
                (reflection,message,field,value & 0xffffffff);
      return true;
    }
    break;
  case 2:
    bVar2 = ConsumeSignedInteger(this,&value,0x7fffffffffffffff);
    if (bVar2) {
      (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x19])
                (reflection,message,field,value);
      return true;
    }
    break;
  case 3:
    bVar2 = ConsumeUnsignedInteger(this,(uint64 *)&value,0xffffffff);
    if (bVar2) {
      (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x1a])
                (reflection,message,field,value & 0xffffffff);
      return true;
    }
    break;
  case 4:
    bVar2 = ConsumeUnsignedInteger(this,(uint64 *)&value,0xffffffffffffffff);
    if (bVar2) {
      (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x1b])
                (reflection,message,field,value);
      return true;
    }
    break;
  case 5:
    bVar2 = ConsumeDouble(this,(double *)&value);
    if (bVar2) {
      (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x1d])
                (value,reflection,message,field);
      return true;
    }
    break;
  case 6:
    bVar2 = ConsumeDouble(this,(double *)&value);
    if (bVar2) {
      (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x1c])
                (CONCAT44(extraout_XMM0_Db,(float)(double)value),reflection,message,field);
      return true;
    }
    break;
  case 7:
    if ((this->tokenizer_).current_.type == TYPE_INTEGER) {
      bVar2 = ConsumeUnsignedInteger(this,(uint64 *)&value,1);
      if (!bVar2) {
        return false;
      }
      (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x1e])
                (reflection,message,field,(ulong)(value != 0));
      return true;
    }
    local_e8 = (char *)0x0;
    local_e0[0]._M_local_buf[0] = '\0';
    value = (int64)local_e0;
    bVar2 = ConsumeIdentifier(this,(string *)&value);
    if (bVar2) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &value,"true");
      if ((bVar2) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&value,"t"), bVar2)) {
        if (*(int *)(field + 0x30) == 3) {
          pp_Var5 = reflection->_vptr_Reflection + 0x3e;
        }
        else {
          pp_Var5 = reflection->_vptr_Reflection + 0x1e;
        }
        bVar6 = 1;
LAB_002217e4:
        (**pp_Var5)(reflection,message,field,(ulong)bVar6);
        goto LAB_002217f2;
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &value,"false");
      if ((bVar2) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&value,"f"), bVar2)) {
        if (*(int *)(field + 0x30) == 3) {
          pp_Var5 = reflection->_vptr_Reflection + 0x3e;
        }
        else {
          pp_Var5 = reflection->_vptr_Reflection + 0x1e;
        }
        bVar6 = 0;
        goto LAB_002217e4;
      }
      std::operator+(&local_70,"Invalid value for boolean field \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
      std::operator+(&local_50,&local_70,"\". Value: \"");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&int_value
                     ,&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value);
      std::operator+(&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&int_value
                     ,"\".");
      ReportError(this,&local_b8);
LAB_00221764:
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&int_value);
      std::__cxx11::string::~string((string *)&local_50);
      this_01 = &local_70;
      goto LAB_002217b7;
    }
    goto LAB_002217bc;
  case 8:
    local_e8 = (char *)0x0;
    local_e0[0]._M_local_buf[0] = '\0';
    this_00 = *(EnumDescriptor **)(field + 0x50);
    if ((this->tokenizer_).current_.type == TYPE_IDENTIFIER) {
      value = (int64)local_e0;
      bVar2 = ConsumeIdentifier(this,(string *)&value);
      if (!bVar2) goto LAB_002217bc;
      pEVar4 = EnumDescriptor::FindValueByName(this_00,(string *)&value);
LAB_002216c5:
      if (pEVar4 != (EnumValueDescriptor *)0x0) {
        (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x20])
                  (reflection,message,field,pEVar4);
LAB_002217f2:
        std::__cxx11::string::~string((string *)&value);
        return true;
      }
      std::operator+(&local_70,"Unknown enumeration value of \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value);
      std::operator+(&local_50,&local_70,"\" for field \"");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&int_value
                     ,&local_50,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
      std::operator+(&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&int_value
                     ,"\".");
      ReportError(this,&local_b8);
      goto LAB_00221764;
    }
    value = (int64)local_e0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"-",(allocator<char> *)&int_value);
    _Var3 = std::operator==(&(this->tokenizer_).current_.text,&local_b8);
    if (_Var3) {
      std::__cxx11::string::~string((string *)&local_b8);
LAB_00221677:
      bVar2 = ConsumeSignedInteger(this,&int_value,0x7fffffff);
      if (!bVar2) goto LAB_002217bc;
      SimpleItoa_abi_cxx11_(&local_b8,(protobuf *)CONCAT44(int_value._4_4_,(int)int_value),i);
      std::__cxx11::string::operator=((string *)&value,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      pEVar4 = EnumDescriptor::FindValueByNumber(this_00,(int)int_value);
      goto LAB_002216c5;
    }
    TVar1 = (this->tokenizer_).current_.type;
    local_78 = this_00;
    std::__cxx11::string::~string((string *)&local_b8);
    this_00 = local_78;
    if (TVar1 == TYPE_INTEGER) goto LAB_00221677;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Expected integer or identifier.",(allocator<char> *)&int_value);
    ReportError(this,&local_b8);
    this_01 = &local_b8;
LAB_002217b7:
    std::__cxx11::string::~string((string *)this_01);
    goto LAB_002217bc;
  case 9:
    local_e8 = (char *)0x0;
    local_e0[0]._M_local_buf[0] = '\0';
    value = (int64)local_e0;
    bVar2 = ConsumeString(this,(string *)&value);
    if (bVar2) {
      (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x1f])
                (reflection,message,field,&value);
      goto LAB_002217f2;
    }
LAB_002217bc:
    std::__cxx11::string::~string((string *)&value);
    break;
  case 10:
    internal::LogMessage::LogMessage
              ((LogMessage *)&value,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/text_format.cc"
               ,0x285);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&value,"Reached an unintended state: CPPTYPE_MESSAGE");
    internal::LogFinisher::operator=((LogFinisher *)&local_b8,other);
    internal::LogMessage::~LogMessage((LogMessage *)&value);
    return true;
  }
  return false;
}

Assistant:

bool ConsumeFieldValue(Message* message,
                         const Reflection* reflection,
                         const FieldDescriptor* field) {

// Define an easy to use macro for setting fields. This macro checks
// to see if the field is repeated (in which case we need to use the Add
// methods or not (in which case we need to use the Set methods).
#define SET_FIELD(CPPTYPE, VALUE)                                  \
        if (field->is_repeated()) {                                \
          reflection->Add##CPPTYPE(message, field, VALUE);         \
        } else {                                                   \
          reflection->Set##CPPTYPE(message, field, VALUE);         \
        }                                                          \

    switch(field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint32max));
        SET_FIELD(Int32, static_cast<int32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT32: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint32max));
        SET_FIELD(UInt32, static_cast<uint32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_INT64: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint64max));
        SET_FIELD(Int64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint64max));
        SET_FIELD(UInt64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_FLOAT: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Float, static_cast<float>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_DOUBLE: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Double, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_STRING: {
        string value;
        DO(ConsumeString(&value));
        SET_FIELD(String, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_BOOL: {
        if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          uint64 value;
          DO(ConsumeUnsignedInteger(&value, 1));
          SET_FIELD(Bool, value);
        } else {
          string value;
          DO(ConsumeIdentifier(&value));
          if (value == "true" || value == "t") {
            SET_FIELD(Bool, true);
          } else if (value == "false" || value == "f") {
            SET_FIELD(Bool, false);
          } else {
            ReportError("Invalid value for boolean field \"" + field->name()
                        + "\". Value: \"" + value  + "\".");
            return false;
          }
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_ENUM: {
        string value;
        const EnumDescriptor* enum_type = field->enum_type();
        const EnumValueDescriptor* enum_value = NULL;

        if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
          DO(ConsumeIdentifier(&value));
          // Find the enumeration value.
          enum_value = enum_type->FindValueByName(value);

        } else if (LookingAt("-") ||
                   LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          int64 int_value;
          DO(ConsumeSignedInteger(&int_value, kint32max));
          value = SimpleItoa(int_value);        // for error reporting
          enum_value = enum_type->FindValueByNumber(int_value);
        } else {
          ReportError("Expected integer or identifier.");
          return false;
        }

        if (enum_value == NULL) {
          ReportError("Unknown enumeration value of \"" + value  + "\" for "
                      "field \"" + field->name() + "\".");
          return false;
        }

        SET_FIELD(Enum, enum_value);
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We should never get here. Put here instead of a default
        // so that if new types are added, we get a nice compiler warning.
        GOOGLE_LOG(FATAL) << "Reached an unintended state: CPPTYPE_MESSAGE";
        break;
      }
    }
#undef SET_FIELD
    return true;
  }